

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

void __thiscall
CMeshClosestPointMapper::CMeshClosestPointMapper
          (CMeshClosestPointMapper *this,ON_Mesh *mesh,ON_2fPointArray *tc,
          ON_RenderMeshInfo *pRenderMeshInfo,ON_Xform *objectXform)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  int iVar8;
  bool bVar9;
  int iVar10;
  ON_MappingMeshInfo *pOVar11;
  ON_RTree *this_00;
  int *pFis_00;
  CMeshClosestPointMapper *this_01;
  int *pFis;
  int nFis;
  ON_Xform *local_30;
  ON_Xform *objectXform_local;
  ON_RenderMeshInfo *pRenderMeshInfo_local;
  ON_2fPointArray *tc_local;
  ON_Mesh *mesh_local;
  CMeshClosestPointMapper *this_local;
  
  local_30 = objectXform;
  objectXform_local = (ON_Xform *)pRenderMeshInfo;
  pRenderMeshInfo_local = (ON_RenderMeshInfo *)tc;
  tc_local = (ON_2fPointArray *)mesh;
  mesh_local = (ON_Mesh *)this;
  IClosestPointMapper::IClosestPointMapper(&this->super_IClosestPointMapper);
  (this->super_IClosestPointMapper)._vptr_IClosestPointMapper =
       (_func_int **)&PTR__CMeshClosestPointMapper_00b72878;
  this->m_mesh = (ON_Mesh *)tc_local;
  this->m_tc = (ON_2fPointArray *)pRenderMeshInfo_local;
  pOVar11 = ON_Mesh::GetMappingMeshInfo((ON_Mesh *)tc_local);
  this->m_pMappingMeshInfo = pOVar11;
  this->m_pRenderMeshInfo = (ON_RenderMeshInfo *)objectXform_local;
  ON_SimpleArray<int>::ON_SimpleArray(&this->m_resFis);
  dVar1 = local_30->m_xform[3][3];
  (this->m_objectXform).m_xform[3][2] = local_30->m_xform[3][2];
  (this->m_objectXform).m_xform[3][3] = dVar1;
  dVar1 = local_30->m_xform[3][1];
  (this->m_objectXform).m_xform[3][0] = local_30->m_xform[3][0];
  (this->m_objectXform).m_xform[3][1] = dVar1;
  dVar1 = local_30->m_xform[2][3];
  (this->m_objectXform).m_xform[2][2] = local_30->m_xform[2][2];
  (this->m_objectXform).m_xform[2][3] = dVar1;
  dVar1 = local_30->m_xform[2][1];
  (this->m_objectXform).m_xform[2][0] = local_30->m_xform[2][0];
  (this->m_objectXform).m_xform[2][1] = dVar1;
  dVar1 = local_30->m_xform[0][0];
  dVar2 = local_30->m_xform[0][1];
  dVar3 = local_30->m_xform[0][2];
  dVar4 = local_30->m_xform[0][3];
  dVar5 = local_30->m_xform[1][0];
  dVar6 = local_30->m_xform[1][1];
  dVar7 = local_30->m_xform[1][3];
  (this->m_objectXform).m_xform[1][2] = local_30->m_xform[1][2];
  (this->m_objectXform).m_xform[1][3] = dVar7;
  (this->m_objectXform).m_xform[1][0] = dVar5;
  (this->m_objectXform).m_xform[1][1] = dVar6;
  (this->m_objectXform).m_xform[0][2] = dVar3;
  (this->m_objectXform).m_xform[0][3] = dVar4;
  (this->m_objectXform).m_xform[0][0] = dVar1;
  (this->m_objectXform).m_xform[0][1] = dVar2;
  ON_Mesh::ON_Mesh(&this->m_sourceMesh);
  this->m_pSourceCPM = (CMeshClosestPointMapper *)0x0;
  SeamTool::SeamTool(&this->m_seamTool,(ON_Mesh *)tc_local,(ON_2fPointArray *)pRenderMeshInfo_local)
  ;
  this->m_totalMappingTol = 0.0;
  this->m_failedFaceMatches = 0;
  this_00 = (ON_RTree *)operator_new(0x48);
  ON_RTree::ON_RTree(this_00,0);
  this->m_pMeshFaceTree = this_00;
  ON_RTree::CreateMeshFaceTree(this->m_pMeshFaceTree,(ON_Mesh *)tc_local);
  this->m_bMeshInfosMatch = false;
  if (((this->m_pMappingMeshInfo != (ON_MappingMeshInfo *)0x0) &&
      (this->m_pRenderMeshInfo != (ON_RenderMeshInfo *)0x0)) &&
     (bVar9 = ON_GeometryFingerprint::Matches
                        (&this->m_pMappingMeshInfo->m_geometryFingerprint,
                         &this->m_pRenderMeshInfo->m_geometryFingerprint,&this->m_objectXform,0.001)
     , bVar9)) {
    this->m_bMeshInfosMatch = true;
    pFis._0_4_ = 0;
    pFis_00 = ON_MappingMeshInfo::SourceIdFaces
                        (this->m_pMappingMeshInfo,this->m_pRenderMeshInfo->m_sourceFaceId,
                         (int *)&pFis);
    iVar8 = (int)pFis;
    if (((0 < (int)pFis) && (pFis_00 != (int *)0x0)) &&
       ((iVar10 = ON_Mesh::FaceCount(this->m_mesh), iVar8 < iVar10 &&
        (bVar9 = CreateSubMesh(this->m_mesh,this->m_tc,(int)pFis,pFis_00,&this->m_sourceMesh), bVar9
        )))) {
      this_01 = (CMeshClosestPointMapper *)operator_new(0x840);
      CMeshClosestPointMapper
                (this_01,&this->m_sourceMesh,&(this->m_sourceMesh).m_T,(ON_RenderMeshInfo *)0x0,
                 local_30);
      this->m_pSourceCPM = this_01;
    }
  }
  return;
}

Assistant:

CMeshClosestPointMapper(const ON_Mesh& mesh, const ON_2fPointArray& tc, const ON_RenderMeshInfo* pRenderMeshInfo, const ON_Xform& objectXform)
	: m_mesh(mesh),
		m_tc(tc),
		m_pMappingMeshInfo(mesh.GetMappingMeshInfo()),
		m_pRenderMeshInfo(pRenderMeshInfo),
		m_objectXform(objectXform),
		m_pSourceCPM(nullptr),
		m_totalMappingTol(0.0),
		m_failedFaceMatches(0),
		m_seamTool(mesh, tc)
	{
    m_pMeshFaceTree = new ON_RTree();
    m_pMeshFaceTree->CreateMeshFaceTree(&mesh);
		m_bMeshInfosMatch = false;
		if (m_pMappingMeshInfo != nullptr && m_pRenderMeshInfo != nullptr)
		{
			if (m_pMappingMeshInfo->m_geometryFingerprint.Matches(m_pRenderMeshInfo->m_geometryFingerprint, m_objectXform, 0.001))
			{
				m_bMeshInfosMatch = true;
				int nFis = 0;
				const int* pFis = m_pMappingMeshInfo->SourceIdFaces(m_pRenderMeshInfo->m_sourceFaceId, nFis);
				if (nFis > 0 && pFis != nullptr && nFis < m_mesh.FaceCount())
				{
					if (CreateSubMesh(m_mesh, m_tc, nFis, pFis, m_sourceMesh))
					{
						m_pSourceCPM = new CMeshClosestPointMapper(m_sourceMesh, m_sourceMesh.m_T, nullptr, objectXform);
					}
				}
			}
		}
	}